

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

void uncreate_artifacts(chunk_conflict *c)

{
  loc grid;
  object *poVar1;
  int y;
  int x;
  
  if (0 < c->height) {
    y = 0;
    do {
      if (0 < c->width) {
        x = 0;
        do {
          grid = (loc)loc(x,y);
          for (poVar1 = square_object(c,grid); poVar1 != (object *)0x0; poVar1 = poVar1->next) {
            if (poVar1->artifact != (artifact *)0x0) {
              mark_artifact_created(poVar1->artifact,false);
            }
          }
          x = x + 1;
        } while (x < c->width);
      }
      y = y + 1;
    } while (y < c->height);
  }
  return;
}

Assistant:

void uncreate_artifacts(struct chunk *c)
{
	int y, x;

	/* Also mark created artifacts as not created ... */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(c, grid);
			while (obj) {
				if (obj->artifact) {
					mark_artifact_created(obj->artifact, false);
				}
				obj = obj->next;
			}
		}
	}
}